

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

ly_bool lys_has_compiled(lys_module *mod)

{
  ulong local_30;
  ulong local_20;
  uint64_t u;
  lys_module *mod_local;
  
  if ((((mod->parsed->data == (lysp_node *)0x0) && (mod->parsed->rpcs == (lysp_node_action *)0x0))
      && (mod->parsed->notifs == (lysp_node_notif *)0x0)) &&
     (((mod->parsed->exts == (lysp_ext_instance *)0x0 &&
       (mod->parsed->augments == (lysp_node_augment *)0x0)) &&
      (mod->parsed->deviations == (lysp_deviation *)0x0)))) {
    local_20 = 0;
    while( true ) {
      if (mod->parsed->includes == (lysp_include *)0x0) {
        local_30 = 0;
      }
      else {
        local_30 = *(ulong *)(mod->parsed->includes[-1].rev + 8);
      }
      if (local_30 <= local_20) {
        return '\0';
      }
      if ((((mod->parsed->includes[local_20].submodule)->data != (lysp_node *)0x0) ||
          ((mod->parsed->includes[local_20].submodule)->rpcs != (lysp_node_action *)0x0)) ||
         (((mod->parsed->includes[local_20].submodule)->notifs != (lysp_node_notif *)0x0 ||
          ((((mod->parsed->includes[local_20].submodule)->exts != (lysp_ext_instance *)0x0 ||
            ((mod->parsed->includes[local_20].submodule)->augments != (lysp_node_augment *)0x0)) ||
           ((mod->parsed->includes[local_20].submodule)->deviations != (lysp_deviation *)0x0))))))
      break;
      local_20 = local_20 + 1;
    }
  }
  return '\x01';
}

Assistant:

ly_bool
lys_has_compiled(const struct lys_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;

    if (LYSP_HAS_COMPILED(mod->parsed)) {
        return 1;
    }

    LY_ARRAY_FOR(mod->parsed->includes, u) {
        if (LYSP_HAS_COMPILED(mod->parsed->includes[u].submodule)) {
            return 1;
        }
    }

    return 0;
}